

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O2

void re2::Parse1NFA(int iters,char *regexp,StringPiece *text)

{
  Regexp *this;
  Prog *this_00;
  bool bVar1;
  StringPiece sp [2];
  undefined1 local_1b0 [8];
  int local_1a8;
  
  if (iters < 1) {
    iters = 0;
  }
  while (bVar1 = iters != 0, iters = iters + -1, bVar1) {
    StringPiece::StringPiece((StringPiece *)local_1b0,regexp);
    this = Regexp::Parse((StringPiece *)local_1b0,LikePerl,(RegexpStatus *)0x0);
    if (this == (Regexp *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x4ab);
      std::operator<<((ostream *)&local_1a8,"Check failed: re");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    this_00 = Regexp::CompileToProg(this,0);
    if (this_00 == (Prog *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x4ad);
      std::operator<<((ostream *)&local_1a8,"Check failed: prog");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    sp[0].ptr_ = (char *)0x0;
    sp[0].length_ = 0;
    sp[1].ptr_ = (char *)0x0;
    sp[1].length_ = 0;
    local_1b0 = (undefined1  [8])0x0;
    local_1a8 = 0;
    bVar1 = Prog::SearchNFA(this_00,text,(StringPiece *)local_1b0,kAnchored,kFullMatch,sp,2);
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x4af);
      std::operator<<((ostream *)&local_1a8,
                      "Check failed: prog->SearchNFA(text, NULL, Prog::kAnchored, Prog::kFullMatch, sp, 2)"
                     );
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    Prog::~Prog(this_00);
    operator_delete(this_00);
    Regexp::Decref(this);
  }
  return;
}

Assistant:

void Parse1NFA(int iters, const char* regexp, const StringPiece& text) {
  for (int i = 0; i < iters; i++) {
    Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
    CHECK(re);
    Prog* prog = re->CompileToProg(0);
    CHECK(prog);
    StringPiece sp[2];  // 2 because sp[0] is whole match.
    CHECK(prog->SearchNFA(text, NULL, Prog::kAnchored, Prog::kFullMatch, sp, 2));
    delete prog;
    re->Decref();
  }
}